

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::setEncryptionOptions(QPDFJob *this,QPDFWriter *w)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Pipeline *pPVar5;
  runtime_error *this_00;
  code *pcVar6;
  undefined *puVar7;
  int iVar8;
  QPDFLogger local_40;
  
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar8 = peVar1->keylen;
  if (iVar8 == 0x28) {
    iVar8 = 2;
LAB_001864c4:
    bVar3 = true;
    bVar2 = false;
LAB_001864c9:
    bVar4 = false;
  }
  else {
    if (iVar8 == 0x100) {
      iVar8 = 6 - (uint)peVar1->force_R5;
      bVar2 = true;
      bVar3 = false;
      goto LAB_001864c9;
    }
    if (iVar8 != 0x80) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error((logic_error *)this_00,"bad encryption keylen");
      puVar7 = &std::logic_error::typeinfo;
      pcVar6 = std::logic_error::~logic_error;
      goto LAB_001867de;
    }
    iVar8 = 4;
    bVar2 = true;
    if (((peVar1->force_V4 == false) && (peVar1->cleartext_metadata == false)) &&
       (peVar1->use_aes == false)) {
      iVar8 = 3;
      goto LAB_001864c4;
    }
    bVar3 = false;
    bVar4 = true;
  }
  if ((bVar2) && (peVar1->r3_accessibility == false)) {
    QPDFLogger::getError
              (&local_40,
               SUB81((peVar1->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,0));
    pPVar5 = Pipeline::operator<<
                       ((Pipeline *)
                        local_40.m.
                        super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->message_prefix);
    pPVar5 = Pipeline::operator<<(pPVar5,": -accessibility=n is ignored for modern");
    Pipeline::operator<<(pPVar5," encryption formats\n");
    if (local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  maybeFixWritePassword
            (this,iVar8,
             &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              user_password);
  maybeFixWritePassword
            (this,iVar8,
             &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              owner_password);
  if (((!bVar3) &&
      ((!bVar4 ||
       (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->use_aes
        != false)))) ||
     (peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1->allow_weak_crypto != false)) {
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(code *)(&DAT_002657b0 + *(int *)(&DAT_002657b0 + (ulong)(iVar8 - 2) * 4)))
              (&DAT_002657b0 + *(int *)(&DAT_002657b0 + (ulong)(iVar8 - 2) * 4),
               (peVar1->user_password)._M_dataplus._M_p,(peVar1->owner_password)._M_dataplus._M_p);
    return;
  }
  QPDFLogger::getError
            (&local_40,
             SUB81((peVar1->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0
                  ));
  pPVar5 = Pipeline::operator<<
                     ((Pipeline *)
                      local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,&((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->message_prefix);
  Pipeline::operator<<
            (pPVar5,
             ": refusing to write a file with RC4, a weak cryptographic algorithm\nPlease use 256-bit keys for better security.\nPass --allow-weak-crypto to enable writing insecure files.\nSee also https://qpdf.readthedocs.io/en/stable/weak-crypto.html\n"
            );
  if (local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"refusing to write a file with weak crypto");
  puVar7 = &std::runtime_error::typeinfo;
  pcVar6 = std::runtime_error::~runtime_error;
LAB_001867de:
  __cxa_throw(this_00,puVar7,pcVar6);
}

Assistant:

void
QPDFJob::setEncryptionOptions(QPDFWriter& w)
{
    int R = 0;
    if (m->keylen == 40) {
        R = 2;
    } else if (m->keylen == 128) {
        if (m->force_V4 || m->cleartext_metadata || m->use_aes) {
            R = 4;
        } else {
            R = 3;
        }
    } else if (m->keylen == 256) {
        if (m->force_R5) {
            R = 5;
        } else {
            R = 6;
        }
    } else {
        throw std::logic_error("bad encryption keylen");
    }
    if ((R > 3) && (m->r3_accessibility == false)) {
        *m->log->getError() << m->message_prefix << ": -accessibility=n is ignored for modern"
                            << " encryption formats\n";
    }
    maybeFixWritePassword(R, m->user_password);
    maybeFixWritePassword(R, m->owner_password);
    if ((R < 4) || ((R == 4) && (!m->use_aes))) {
        if (!m->allow_weak_crypto) {
            QTC::TC("qpdf", "QPDFJob weak crypto error");
            *m->log->getError()
                << m->message_prefix
                << ": refusing to write a file with RC4, a weak cryptographic algorithm\n"
                   "Please use 256-bit keys for better security.\n"
                   "Pass --allow-weak-crypto to enable writing insecure files.\n"
                   "See also https://qpdf.readthedocs.io/en/stable/weak-crypto.html\n";
            throw std::runtime_error("refusing to write a file with weak crypto");
        }
    }
    switch (R) {
    case 2:
        w.setR2EncryptionParametersInsecure(
            m->user_password.c_str(),
            m->owner_password.c_str(),
            m->r2_print,
            m->r2_modify,
            m->r2_extract,
            m->r2_annotate);
        break;
    case 3:
        w.setR3EncryptionParametersInsecure(
            m->user_password.c_str(),
            m->owner_password.c_str(),
            m->r3_accessibility,
            m->r3_extract,
            m->r3_assemble,
            m->r3_annotate_and_form,
            m->r3_form_filling,
            m->r3_modify_other,
            m->r3_print);
        break;
    case 4:
        w.setR4EncryptionParametersInsecure(
            m->user_password.c_str(),
            m->owner_password.c_str(),
            m->r3_accessibility,
            m->r3_extract,
            m->r3_assemble,
            m->r3_annotate_and_form,
            m->r3_form_filling,
            m->r3_modify_other,
            m->r3_print,
            !m->cleartext_metadata,
            m->use_aes);
        break;
    case 5:
        w.setR5EncryptionParameters(
            m->user_password.c_str(),
            m->owner_password.c_str(),
            m->r3_accessibility,
            m->r3_extract,
            m->r3_assemble,
            m->r3_annotate_and_form,
            m->r3_form_filling,
            m->r3_modify_other,
            m->r3_print,
            !m->cleartext_metadata);
        break;
    case 6:
        w.setR6EncryptionParameters(
            m->user_password.c_str(),
            m->owner_password.c_str(),
            m->r3_accessibility,
            m->r3_extract,
            m->r3_assemble,
            m->r3_annotate_and_form,
            m->r3_form_filling,
            m->r3_modify_other,
            m->r3_print,
            !m->cleartext_metadata);
        break;
    default:
        throw std::logic_error("bad encryption R value");
        break;
    }
}